

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

int __thiscall sjtu::UserManager::init(UserManager *this,EVP_PKEY_CTX *ctx)

{
  _Ios_Openmode _Var1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar2;
  FileManager<sjtu::userType> *pFVar3;
  ifstream infile;
  ofstream outfile;
  undefined8 in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  allocator *filepath;
  char local_4c8 [520];
  char local_2c0 [519];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [38];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  UserManager *local_8;
  
  local_9 = (byte)ctx & 1;
  local_8 = this;
  if (((ulong)ctx & 1) == 0) {
    pBVar2 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_45 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"UserBpTree.dat",&local_31);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar2,in_stack_fffffffffffffb18,(uint)((ulong)in_stack_fffffffffffffb10 >> 0x20));
    local_45 = 0;
    this->UserBpTree = pBVar2;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pFVar3 = (FileManager<sjtu::userType> *)operator_new(0x228);
    local_6a = 1;
    filepath = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"UserFile.dat",filepath);
    FileManager<sjtu::userType>::FileManager
              ((FileManager<sjtu::userType> *)pBVar2,(string *)filepath,
               (uint)((ulong)pFVar3 >> 0x20));
    local_6a = 0;
    this->UserFile = pFVar3;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    pBVar2 = this->UserBpTree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"UserBpTree.dat",&local_91);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar2,(EVP_PKEY_CTX *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pFVar3 = this->UserFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"UserFile.dat",&local_b9);
    (**(pFVar3->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base)
              (pFVar3,local_b8,0x20,1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  if (((this->UserFile->super_FileManager_Base<sjtu::userType>).is_newfile & 1U) == 0) {
    std::ifstream::ifstream(local_4c8,"OnlineFlag.dat",_S_in);
    std::istream::read(local_4c8,(long)&this->online_flag);
    std::ifstream::close();
    std::ifstream::~ifstream(local_4c8);
  }
  else {
    _Var1 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_2c0,"OnlineFlag.dat",_Var1);
    this->online_flag = 0;
    std::ostream::write(local_2c0,(long)&this->online_flag);
    std::ofstream::close();
    std::ofstream::~ofstream(local_2c0);
  }
  this->online_flag = this->online_flag + 1;
  return (int)this;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                UserBpTree = new BplusTree<StringHasher::hashType, locType>(std::string("UserBpTree.dat") , UserBpTree_cache_size);
                UserFile = new FileManager<userType>(std::string("UserFile.dat") , UserFile_cache_size);
            } else {
                UserBpTree->init(std::string("UserBpTree.dat") , UserBpTree_cache_size , true);
                UserFile->init(std::string("UserFile.dat") , UserFile_cache_size , true);
            }
            if (UserFile -> is_newfile)
            {
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	online_flag = 0 , outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
            }
            else
            {
            	std::ifstream infile("OnlineFlag.dat" , std::ios_base::in);
            	infile.read(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	infile.close();
            }
            ++ online_flag;
        }